

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# two_level_iterator.cc
# Opt level: O1

void __thiscall leveldb::anon_unknown_7::TwoLevelIterator::~TwoLevelIterator(TwoLevelIterator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  Iterator *pIVar3;
  char *pcVar4;
  
  (this->super_Iterator)._vptr_Iterator = (_func_int **)&PTR__TwoLevelIterator_001316b0;
  pcVar2 = (this->data_block_handle_)._M_dataplus._M_p;
  paVar1 = &(this->data_block_handle_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pIVar3 = (this->data_iter_).iter_;
  if (pIVar3 != (Iterator *)0x0) {
    (*pIVar3->_vptr_Iterator[1])();
  }
  pIVar3 = (this->index_iter_).iter_;
  if (pIVar3 != (Iterator *)0x0) {
    (*pIVar3->_vptr_Iterator[1])();
  }
  pcVar4 = (this->status_).state_;
  if (pcVar4 != (char *)0x0) {
    operator_delete__(pcVar4);
  }
  Iterator::~Iterator(&this->super_Iterator);
  return;
}

Assistant:

TwoLevelIterator::~TwoLevelIterator() = default;